

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Instruction * __thiscall spv::Builder::addInstruction(Builder *this,Op op)

{
  _Head_base<0UL,_spv::Instruction_*,_false> _Var1;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  _Head_base<0UL,_spv::Instruction_*,_false> local_28;
  Op local_1c;
  
  local_1c = op;
  std::make_unique<spv::Instruction,spv::Op&>((Op *)&local_28);
  _Var1._M_head_impl = local_28._M_head_impl;
  local_30._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (Instruction *)0x0;
  Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
  if (local_30._M_head_impl != (Instruction *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Instruction[1])();
  }
  local_30._M_head_impl = (Instruction *)0x0;
  if (local_28._M_head_impl != (Instruction *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Instruction[1])();
  }
  return _Var1._M_head_impl;
}

Assistant:

spv::Instruction *Builder::addInstruction(spv::Op op)
{
    auto inst = std::make_unique<spv::Instruction>(op);
    auto *ret = inst.get();
    getBuildPoint()->addInstruction(std::move(inst));
    return ret;
}